

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeLibTests.cxx
# Opt level: O0

int main(int ac,char **av)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  int result;
  char *test_name;
  double time_taken;
  char *name;
  char *status_message;
  int status;
  clock_t t;
  char *pcStack_30;
  int testToRun;
  char *arg;
  int run_all;
  int partial_match;
  int testNum;
  int i;
  char **av_local;
  int ac_local;
  
  av_local._4_4_ = 0;
  run_all = 0;
  t._4_4_ = -1;
  _testNum = av;
  av_local._0_4_ = ac;
  if (ac < 2) {
    printf("Available tests:\n");
    for (partial_match = 0; partial_match < 7; partial_match = partial_match + 1) {
      printf("%3d. %s\n",(ulong)(uint)partial_match,
             cmakeGeneratedFunctionMapEntries[partial_match].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&run_all);
    if (iVar1 != 1) {
      printf("Couldn\'t parse that input as a number\n");
      return -1;
    }
    if (6 < run_all) {
      printf("%3d is an invalid test number.\n",(ulong)(uint)run_all);
      return -1;
    }
    t._4_4_ = run_all;
    av_local._0_4_ = (int)av_local + -1;
    _testNum = _testNum + 1;
  }
  arg._4_4_ = 0;
  bVar6 = false;
  pcStack_30 = (char *)0x0;
  if ((t._4_4_ == -1) && (1 < (int)av_local)) {
    iVar1 = strcmp(_testNum[1],"-R");
    arg._4_4_ = (uint)(iVar1 == 0);
    iVar1 = strcmp(_testNum[1],"-A");
    bVar6 = iVar1 == 0;
  }
  if ((arg._4_4_ == 0) || (2 < (int)av_local)) {
    if (bVar6) {
      printf("TAP version 13\n");
      printf("1..%d\n",7);
      for (partial_match = 0; partial_match < 7; partial_match = partial_match + 1) {
        pcVar5 = cmakeGeneratedFunctionMapEntries[partial_match].name;
        if (((int)av_local < 3) ||
           (iVar1 = isTestSkipped(pcVar5,(int)av_local + -2,_testNum + 2), iVar1 != 1)) {
          cVar2 = clock();
          iVar1 = (*cmakeGeneratedFunctionMapEntries[partial_match].func)((int)av_local,_testNum);
          cVar3 = clock();
          pcVar4 = "ok";
          if (iVar1 == -1) {
            pcVar4 = "not ok";
          }
          printf("%s %d %s # %f\n",(double)(cVar3 - cVar2) / 1000000.0,pcVar4,
                 (ulong)(partial_match + 1),pcVar5);
        }
        else {
          printf("ok %d %s # SKIP\n",(ulong)(partial_match + 1),pcVar5);
        }
      }
      printf("All tests finished.\n");
      av_local._4_4_ = 0;
    }
    else {
      if (t._4_4_ == -1) {
        pcStack_30 = lowercase(_testNum[(int)(arg._4_4_ + 1)]);
      }
      for (partial_match = 0; partial_match < 7 && t._4_4_ == -1; partial_match = partial_match + 1)
      {
        pcVar5 = lowercase(cmakeGeneratedFunctionMapEntries[partial_match].name);
        if ((arg._4_4_ == 0) || (pcVar4 = strstr(pcVar5,pcStack_30), pcVar4 == (char *)0x0)) {
          if ((arg._4_4_ == 0) && (iVar1 = strcmp(pcVar5,pcStack_30), iVar1 == 0)) {
            t._4_4_ = partial_match;
            av_local._0_4_ = (int)av_local + -1;
            _testNum = _testNum + 1;
          }
        }
        else {
          t._4_4_ = partial_match;
          av_local._0_4_ = (int)av_local + -2;
          _testNum = _testNum + 2;
        }
        free(pcVar5);
      }
      free(pcStack_30);
      if (t._4_4_ == -1) {
        printf("Available tests:\n");
        for (partial_match = 0; partial_match < 7; partial_match = partial_match + 1) {
          printf("%3d. %s\n",(ulong)(uint)partial_match,
                 cmakeGeneratedFunctionMapEntries[partial_match].name);
        }
        printf("Failed: %s is an invalid test name.\n",_testNum[1]);
        av_local._4_4_ = -1;
      }
      else if ((t._4_4_ < 0) || (6 < t._4_4_)) {
        printf("testToRun was modified by TestDriver code to an invalid value: %3d.\n",
               (ulong)(uint)run_all);
        av_local._4_4_ = -1;
      }
      else {
        av_local._4_4_ = (*cmakeGeneratedFunctionMapEntries[t._4_4_].func)((int)av_local,_testNum);
      }
    }
  }
  else {
    printf("-R needs an additional parameter.\n");
    av_local._4_4_ = -1;
  }
  return av_local._4_4_;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}